

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O1

string * __thiscall
svg::LineChart::polylineToString_abi_cxx11_
          (string *__return_storage_ptr__,LineChart *this,Polyline *polyline,Layout *layout)

{
  size_type *psVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  string *psVar5;
  pointer pPVar6;
  Dimensions *pDVar7;
  undefined8 *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 uVar12;
  bool bVar13;
  vector<svg::Circle,_std::allocator<svg::Circle>_> vertices;
  Polyline shifted_polyline;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  vector<svg::Circle,_std::allocator<svg::Circle>_> local_170;
  vector<svg::Circle,_std::allocator<svg::Circle>_> local_158;
  string *local_138;
  string local_130;
  Circle local_110;
  Polyline local_a0;
  
  local_a0.super_Shape.fill.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Fill_0010ebc0;
  local_a0.super_Shape.fill.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_0010eaa0;
  local_a0.super_Shape.fill.color.transparent = (polyline->super_Shape).fill.color.transparent;
  local_a0.super_Shape.fill.color._9_3_ =
       *(undefined3 *)&(polyline->super_Shape).fill.color.field_0x9;
  local_a0.super_Shape.fill.color.red = (polyline->super_Shape).fill.color.red;
  local_a0.super_Shape.fill.color.green = (polyline->super_Shape).fill.color.green;
  local_a0.super_Shape.fill.color.blue = (polyline->super_Shape).fill.color.blue;
  local_a0.super_Shape.stroke.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Stroke_0010eaf0;
  local_a0.super_Shape.stroke.width = (polyline->super_Shape).stroke.width;
  local_a0.super_Shape.stroke.color.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Serializeable_0010eaa0;
  local_a0.super_Shape.stroke.color.transparent = (polyline->super_Shape).stroke.color.transparent;
  local_a0.super_Shape.stroke.color._9_3_ =
       *(undefined3 *)&(polyline->super_Shape).stroke.color.field_0x9;
  local_a0.super_Shape.stroke.color.red = (polyline->super_Shape).stroke.color.red;
  local_a0.super_Shape.stroke.color.green = (polyline->super_Shape).stroke.color.green;
  local_a0.super_Shape.stroke.color.blue = (polyline->super_Shape).stroke.color.blue;
  local_a0.super_Shape.stroke.nonScaling = (polyline->super_Shape).stroke.nonScaling;
  local_a0.super_Shape.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Polyline_0010ec48;
  local_138 = __return_storage_ptr__;
  std::vector<svg::Point,_std::allocator<svg::Point>_>::vector(&local_a0.points,&polyline->points);
  if ((long)local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    dVar3 = (this->margin).width;
    dVar4 = (this->margin).height;
    uVar9 = 1;
    pPVar6 = local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pPVar6->x = pPVar6->x + dVar3;
      pPVar6->y = pPVar6->y + dVar4;
      uVar10 = (ulong)uVar9;
      pPVar6 = pPVar6 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar10 < (ulong)((long)local_a0.points.
                                    super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_a0.points.
                                    super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 4));
  }
  local_158.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
    uVar11 = 1;
    do {
      pPVar6 = local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
               super__Vector_impl_data._M_start;
      getDimensions((optional<svg::Dimensions> *)&local_130,this);
      pDVar7 = optional<svg::Dimensions>::operator->((optional<svg::Dimensions> *)&local_130);
      local_110.super_Shape.fill.super_Serializeable._vptr_Serializeable =
           (_func_int **)&PTR__Fill_0010ebc0;
      local_110.super_Shape.fill.color.super_Serializeable._vptr_Serializeable =
           (_func_int **)&PTR__Serializeable_0010eaa0;
      local_110.super_Shape.fill.color.transparent = false;
      local_110.super_Shape.fill.color.red = 0;
      local_110.super_Shape.fill.color.green = 0;
      local_110.super_Shape.fill.color.blue = 0;
      local_110.super_Shape.stroke.super_Serializeable._vptr_Serializeable =
           (_func_int **)&PTR__Stroke_0010eaf0;
      local_110.super_Shape.stroke.width = -1.0;
      local_110.super_Shape.stroke.color.super_Serializeable._vptr_Serializeable =
           (_func_int **)&PTR__Serializeable_0010eaa0;
      local_110.super_Shape.stroke.color.transparent = true;
      local_110.super_Shape.stroke.color.blue = 0;
      local_110.super_Shape.stroke.nonScaling = false;
      local_110.super_Shape.stroke.color._12_5_ = 0;
      local_110.super_Shape.stroke.color.green._1_3_ = 0;
      local_110.super_Shape.super_Serializeable._vptr_Serializeable =
           (_func_int **)&PTR__Shape_0010ec90;
      local_110.center.x = pPVar6[uVar10].x;
      local_110.center.y = pPVar6[uVar10].y;
      local_110.radius = (pDVar7->height / 30.0) * 0.5;
      std::vector<svg::Circle,_std::allocator<svg::Circle>_>::emplace_back<svg::Circle>
                (&local_158,&local_110);
      bVar13 = uVar11 < (ulong)((long)local_a0.points.
                                      super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_a0.points.
                                      super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 4);
      uVar10 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar13);
  }
  Polyline::toString_abi_cxx11_(&local_130,&local_a0,layout);
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::vector(&local_170,&local_158);
  local_188 = 0;
  local_180 = 0;
  local_190 = &local_180;
  if (local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar10 = 0;
    uVar11 = 1;
    do {
      (*local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10].super_Shape.super_Serializeable._vptr_Serializeable
        [2])(&local_110,
             local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>._M_impl.
             super__Vector_impl_data._M_start + uVar10,layout);
      std::__cxx11::string::_M_append
                ((char *)&local_190,
                 (ulong)local_110.super_Shape.super_Serializeable._vptr_Serializeable);
      if ((Color *)local_110.super_Shape.super_Serializeable._vptr_Serializeable !=
          &local_110.super_Shape.fill.color) {
        operator_delete(local_110.super_Shape.super_Serializeable._vptr_Serializeable);
      }
      uVar10 = ((long)local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_170.super__Vector_base<svg::Circle,_std::allocator<svg::Circle>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
      bVar13 = uVar11 <= uVar10;
      lVar2 = uVar10 - uVar11;
      uVar10 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar13 && lVar2 != 0);
  }
  psVar5 = local_138;
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    uVar12 = local_130.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_188 + local_130._M_string_length) {
    uVar10 = 0xf;
    if (local_190 != &local_180) {
      uVar10 = CONCAT71(uStack_17f,local_180);
    }
    if (local_188 + local_130._M_string_length <= uVar10) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_190,0,(char *)0x0,(ulong)local_130._M_dataplus._M_p);
      goto LAB_0010722b;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_190);
LAB_0010722b:
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  psVar1 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar1) {
    uVar12 = puVar8[3];
    (psVar5->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&psVar5->field_2 + 8) = uVar12;
  }
  else {
    (psVar5->_M_dataplus)._M_p = (pointer)*puVar8;
    (psVar5->field_2)._M_allocated_capacity = *psVar1;
  }
  psVar5->_M_string_length = puVar8[1];
  *puVar8 = psVar1;
  puVar8[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::~vector(&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  std::vector<svg::Circle,_std::allocator<svg::Circle>_>::~vector(&local_158);
  local_a0.super_Shape.super_Serializeable._vptr_Serializeable =
       (_func_int **)&PTR__Polyline_0010ec48;
  if (local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.points.super__Vector_base<svg::Point,_std::allocator<svg::Point>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return psVar5;
}

Assistant:

std::string polylineToString(Polyline const & polyline, Layout const & layout) const
        {
            Polyline shifted_polyline = polyline;
            shifted_polyline.offset(Point(margin.width, margin.height));

            std::vector<Circle> vertices;
            for (unsigned i = 0; i < shifted_polyline.points.size(); ++i)
                vertices.push_back(Circle(shifted_polyline.points[i], getDimensions()->height / 30.0, Color::Black));

            return shifted_polyline.toString(layout) + vectorToString(vertices, layout);
        }